

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  uint64_t uVar2;
  _func_int *p_Var3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  element_type *peVar8;
  char cVar9;
  int iVar10;
  ostream *poVar11;
  long lVar12;
  int iVar13;
  _List_node_base *p_Var14;
  int iVar15;
  char **ppcVar16;
  ulong uVar17;
  bool showHelp;
  uint32_t minutes;
  int local_6a4;
  allocator<char> local_6a0;
  allocator<char> local_69f;
  allocator<char> local_69e;
  allocator<char> local_69d;
  allocator<char> local_69c;
  allocator<char> local_69b;
  allocator<char> local_69a;
  allocator<char> local_699;
  allocator<char> local_698;
  allocator<char> local_697;
  allocator<char> local_696;
  allocator<char> local_695;
  allocator<char> local_694;
  allocator<char> local_693;
  allocator<char> local_692;
  allocator<char> local_691;
  uint64_t permutations;
  uint32_t hours;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_680;
  uint64_t start;
  _func_int *local_670;
  any local_668;
  ScriptPtr script;
  undefined4 uStack_644;
  undefined4 uStack_640;
  undefined4 uStack_63c;
  __shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2> local_638;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628;
  string local_618 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f8;
  __shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2> local_5e0;
  list<std::thread,_std::allocator<std::thread>_> threadList;
  string local_590 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_570;
  string local_558 [32];
  value_type local_538;
  value_type local_518;
  string local_4f8;
  string local_4d8 [32];
  value_type local_4b8;
  value_type local_498;
  string local_478;
  string local_458 [32];
  value_type local_438;
  value_type local_418;
  string local_3f8;
  string local_3d8 [32];
  value_type local_3b8;
  value_type local_398;
  string local_378;
  _Any_data local_358;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined4 local_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_2f8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined4 local_2d0;
  undefined1 local_2cc;
  Parser local_2c0;
  InternalParseResult result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  RuntimePtr runtime;
  Parser local_170;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_110;
  Parser parser;
  Parser local_90;
  
  permutations = 0;
  start = 0;
  minutes = 0;
  hours = 0;
  showHelp = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"permutations",&local_691)
  ;
  clara::detail::Opt::Opt<unsigned_long>((Opt *)&local_358,&permutations,&local_378);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"-p",&local_692);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&vStack_2f8,&local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"--permutations",&local_693);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&vStack_2f8,&local_3b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d8,"Max number of permutations to run",&local_694);
  std::__cxx11::string::_M_assign((string *)&uStack_318);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"start",&local_695);
  clara::detail::Opt::Opt<unsigned_long>((Opt *)&result,&start,&local_3f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"-s",&local_696);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_200,&local_418);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"--start",&local_697);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_200,&local_438);
  std::__cxx11::string::string<std::allocator<char>>(local_458,"Starting permutation",&local_698);
  std::__cxx11::string::_M_assign((string *)&result.m_errorMessage);
  clara::detail::ComposableParserImpl<clara::detail::Opt>::operator|
            (&local_90,(ComposableParserImpl<clara::detail::Opt> *)&local_358,(Opt *)&result);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"minutes",&local_699);
  clara::detail::Opt::Opt<unsigned_int>((Opt *)&script,&minutes,&local_478);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"-m",&local_69a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_5f8,&local_498);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"--minutes",&local_69b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_5f8,&local_4b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4d8,"Minutes to run fuzz tests",&local_69c);
  std::__cxx11::string::_M_assign(local_618);
  clara::detail::Parser::operator|(&local_170,&local_90,(Opt *)&script);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"hours",&local_69d);
  clara::detail::Opt::Opt<unsigned_int>((Opt *)&threadList,&hours,&local_4f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"-h",&local_69e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_570,&local_518);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"--hours",&local_69f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_570,&local_538);
  std::__cxx11::string::string<std::allocator<char>>(local_558,"Hours to run fuzz tests",&local_6a0)
  ;
  std::__cxx11::string::_M_assign(local_590);
  clara::detail::Parser::operator|(&local_2c0,&local_170,(Opt *)&threadList);
  clara::detail::Help::Help((Help *)&runtime,&showHelp);
  clara::detail::Parser::operator|(&parser,&local_2c0,(Help *)&runtime);
  clara::detail::Opt::~Opt((Opt *)&runtime);
  clara::detail::Parser::~Parser(&local_2c0);
  std::__cxx11::string::~string(local_558);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_518);
  clara::detail::Opt::~Opt((Opt *)&threadList);
  std::__cxx11::string::~string((string *)&local_4f8);
  clara::detail::Parser::~Parser(&local_170);
  std::__cxx11::string::~string(local_4d8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_498);
  clara::detail::Opt::~Opt((Opt *)&script);
  std::__cxx11::string::~string((string *)&local_478);
  clara::detail::Parser::~Parser(&local_90);
  std::__cxx11::string::~string(local_458);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_418);
  clara::detail::Opt::~Opt((Opt *)&result);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string(local_3d8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_398);
  clara::detail::Opt::~Opt((Opt *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  clara::detail::Args::Args((Args *)&local_358,argc,argv);
  clara::detail::ParserBase::parse(&result,&parser.super_ParserBase,(Args *)&local_358);
  clara::detail::Args::~Args((Args *)&local_358);
  if (result.super_ResultValueBase<clara::detail::ParseState>.super_ResultBase.m_type != Ok) {
    poVar11 = std::operator<<((ostream *)&std::cerr,"Error in command line: ");
    std::__cxx11::string::string((string *)local_358._M_pod_data,(string *)&result.m_errorMessage);
    poVar11 = std::operator<<(poVar11,(string *)local_358._M_pod_data);
    std::operator<<(poVar11,"\n");
    std::__cxx11::string::~string((string *)local_358._M_pod_data);
    iVar15 = -1;
LAB_00107282:
    clara::detail::BasicResult<clara::detail::ParseState>::~BasicResult(&result);
    clara::detail::Parser::~Parser(&parser);
    return iVar15;
  }
  if (showHelp == true) {
    clara::detail::Parser::writeToStream(&parser,(ostream *)&std::cout);
    iVar15 = 0;
    goto LAB_00107282;
  }
  if (hours == 0 && (minutes == 0 && permutations == 0)) {
    permutations = 100000;
  }
  else {
    if (hours != 0) {
      minutes = minutes + hours * 0x3c;
    }
    if ((permutations == 0) && (minutes != 0)) {
      permutations = 1000000000000;
      goto LAB_00106eca;
    }
    if (minutes != 0) goto LAB_00106eca;
  }
  minutes = 60000;
LAB_00106eca:
  lVar12 = std::chrono::_V2::system_clock::now();
  uVar17 = (ulong)minutes;
  local_348 = 0;
  uStack_340 = 0;
  local_358._M_unused._M_object = (void *)0x0;
  local_358._8_8_ = 0;
  local_330 = 0;
  uStack_328 = 0;
  local_320 = 0;
  uStack_318 = 0;
  local_310 = 0;
  uStack_308 = 0;
  local_300 = 0;
  vStack_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0 = 0;
  uStack_2d8 = 0;
  local_2d0 = 2000;
  local_2cc = 1;
  local_338 = 0x1000000;
  Jinx::Initialize((GlobalParams *)&local_358);
  Jinx::CreateRuntime();
  local_670 = (_func_int *)(uVar17 * 60000000000 + lVar12);
  local_680 = &script.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  lVar12 = 0;
  ppcVar16 = s_testScripts;
  local_6a4 = 0;
  while (peVar8 = runtime.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        lVar12 != 0x21) {
    pcVar1 = *ppcVar16;
    std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
    basic_string<Jinx::Allocator<char>>
              ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&local_110,
               "Test Script",(Allocator<char> *)&local_2c0);
    std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
    basic_string<Jinx::Allocator<char>>
              ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&script,"core",
               (Allocator<char> *)&local_170);
    (**peVar8->_vptr_IRuntime)
              (&threadList,peVar8,pcVar1,&local_110,
               (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&script,1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&script);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_110);
    peVar8 = runtime.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (threadList.super__List_base<std::thread,_std::allocator<std::thread>_>._M_impl._M_node.
        super__List_node_base._M_next == (_List_node_base *)0x0) {
      poVar11 = std::operator<<((ostream *)&std::cerr,"Unable to compile test script #");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::operator<<(poVar11,"\n");
      cVar9 = '\0';
      local_6a4 = -1;
    }
    else {
      std::__shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_5e0,(__shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2> *)&threadList);
      local_668._M_manager = std::any::_Manager_internal<std::nullptr_t>::_S_manage;
      local_668._M_storage._M_ptr = (void *)0x0;
      (*peVar8->_vptr_IRuntime[1])
                ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&script,
                 peVar8,&local_5e0,&local_668);
      std::any::reset(&local_668);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5e0._M_refcount);
      cVar9 = (*(code *)**(undefined8 **)
                          CONCAT44(script.
                                   super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr._4_4_,
                                   (int)script.
                                        super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr))();
      if (cVar9 == '\0') {
        poVar11 = std::operator<<((ostream *)&std::cerr,"Unable to execute test script #");
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::operator<<(poVar11,"\n");
        local_6a4 = -1;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&script.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &threadList.super__List_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                _M_node.super__List_node_base._M_prev);
    lVar12 = lVar12 + 1;
    ppcVar16 = ppcVar16 + 1;
    if (cVar9 == '\0') goto LAB_00107264;
  }
  threadList.super__List_base<std::thread,_std::allocator<std::thread>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&threadList;
  threadList.super__List_base<std::thread,_std::allocator<std::thread>_>._M_impl._M_node._M_size = 0
  ;
  threadList.super__List_base<std::thread,_std::allocator<std::thread>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       threadList.super__List_base<std::thread,_std::allocator<std::thread>_>._M_impl._M_node.
       super__List_node_base._M_next;
  iVar10 = std::thread::hardware_concurrency();
  p_Var3 = local_670;
  iVar13 = 0;
  iVar15 = iVar10;
  if (iVar10 < 1) {
    iVar15 = 0;
  }
  for (; uVar2 = permutations, iVar15 != iVar13; iVar13 = iVar13 + 1) {
    script.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)start;
    script.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = iVar13;
    std::__shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_638,&runtime.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>);
    local_628._M_allocated_capacity = (size_type)p_Var3;
    local_170.super_ParserBase._vptr_ParserBase = (_func_int **)0x0;
    local_2c0.super_ParserBase._vptr_ParserBase = (_func_int **)operator_new(0x40);
    *local_2c0.super_ParserBase._vptr_ParserBase = (_func_int *)&PTR___State_impl_0014f1a8;
    uStack_640 = (undefined4)uVar2;
    uStack_63c = (undefined4)(uVar2 >> 0x20);
    uVar4 = local_638._M_ptr._0_4_;
    uVar5 = local_638._M_ptr._4_4_;
    uVar6 = local_638._M_refcount._M_pi._0_4_;
    uVar7 = local_638._M_refcount._M_pi._4_4_;
    local_638._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(int *)(local_2c0.super_ParserBase._vptr_ParserBase + 1) =
         (int)script.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(undefined4 *)((long)local_2c0.super_ParserBase._vptr_ParserBase + 0xc) =
         script.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_;
    *(undefined4 *)(local_2c0.super_ParserBase._vptr_ParserBase + 2) =
         script.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
         _0_4_;
    *(undefined4 *)((long)local_2c0.super_ParserBase._vptr_ParserBase + 0x14) =
         script.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
         _4_4_;
    local_638._M_ptr = (element_type *)0x0;
    *(int *)(local_2c0.super_ParserBase._vptr_ParserBase + 3) = iVar10;
    *(undefined4 *)((long)local_2c0.super_ParserBase._vptr_ParserBase + 0x1c) = uStack_644;
    *(undefined4 *)(local_2c0.super_ParserBase._vptr_ParserBase + 4) = uStack_640;
    *(undefined4 *)((long)local_2c0.super_ParserBase._vptr_ParserBase + 0x24) = uStack_63c;
    *(undefined4 *)(local_2c0.super_ParserBase._vptr_ParserBase + 5) = uVar4;
    *(undefined4 *)((long)local_2c0.super_ParserBase._vptr_ParserBase + 0x2c) = uVar5;
    *(undefined4 *)(local_2c0.super_ParserBase._vptr_ParserBase + 6) = uVar6;
    *(undefined4 *)((long)local_2c0.super_ParserBase._vptr_ParserBase + 0x34) = uVar7;
    local_2c0.super_ParserBase._vptr_ParserBase[7] = p_Var3;
    std::thread::_M_start_thread(&local_170,&local_2c0,0);
    if (local_2c0.super_ParserBase._vptr_ParserBase != (_func_int **)0x0) {
      (**(code **)(*local_2c0.super_ParserBase._vptr_ParserBase + 8))();
    }
    std::__cxx11::list<std::thread,_std::allocator<std::thread>_>::push_back
              (&threadList,(value_type *)&local_170);
    std::thread::~thread((thread *)&local_170);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_638._M_refcount);
  }
  p_Var14 = (_List_node_base *)&threadList;
  while (p_Var14 = (((_List_base<std::thread,_std::allocator<std::thread>_> *)&p_Var14->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next,
        p_Var14 != (_List_node_base *)&threadList) {
    std::thread::join();
  }
  std::__cxx11::list<std::thread,_std::allocator<std::thread>_>::clear
            ((list<std::thread,_std::allocator<std::thread>_> *)
             &threadList.super__List_base<std::thread,_std::allocator<std::thread>_>);
  std::__cxx11::_List_base<std::thread,_std::allocator<std::thread>_>::_M_clear
            (&threadList.super__List_base<std::thread,_std::allocator<std::thread>_>);
  local_6a4 = 0;
LAB_00107264:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&runtime.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Jinx::GlobalParams::~GlobalParams((GlobalParams *)&local_358);
  iVar15 = local_6a4;
  goto LAB_00107282;
}

Assistant:

int main(int argc, char * argv[])
{
	// Handle command-line options
	uint64_t permutations = 0;
	uint64_t start = 0;
	uint32_t minutes = 0;
	uint32_t hours = 0;
	bool showHelp = false;
	auto parser =
		Opt(permutations, "permutations")["-p"]["--permutations"]("Max number of permutations to run") |
		Opt(start, "start")["-s"]["--start"]("Starting permutation") |
		Opt(minutes, "minutes")["-m"]["--minutes"]("Minutes to run fuzz tests") |
		Opt(hours, "hours")["-h"]["--hours"]("Hours to run fuzz tests") |
		Help(showHelp);

	auto result = parser.parse(Args(argc, argv));
	if (!result)
	{
		std::cerr << "Error in command line: " << result.errorMessage() << "\n";
		return -1;
	}
	else if (showHelp)
	{
		parser.writeToStream(std::cout);
		return 0;
	}

	// Set max permutations and/or time to run
	if (!permutations && !minutes && !hours)
	{
		// Pick a default number of permutations to run if no arguments are passed
		permutations = 100'000;

	}
	else
	{
		// Convert hours to minutes
		if (hours)
			minutes += (hours * 60);

		if (minutes)
		{
			// If permutation limit hasn't been specified
			if (!permutations)
				permutations = 1'000'000'000'000;
		}
	}

	if (!minutes)
	{
		// If time isn't specified, set max time to 1000 hours
		minutes = 60 * 1000;
	}

	// Start timer
	const auto startTime = std::chrono::system_clock::now();
	const auto stopTime = startTime + std::chrono::minutes(minutes);

	// Initialize Jinx and
	Jinx::GlobalParams globalParams;
	globalParams.logSymbols = false;
	globalParams.logBytecode = false;
	globalParams.enableLogging = false;
	Jinx::Initialize(globalParams);
	auto runtime = CreateRuntime();

	// Validate that all scripts compile and execute successfully
	for (auto i = 0u; i < std::size(s_testScripts); ++i)
	{
		// Compile the text to bytecode
		auto bytecode = runtime->Compile(s_testScripts[i], "Test Script", { "core" });
		if (!bytecode)
		{
			std::cerr << "Unable to compile test script #" << i << "\n";
			return -1;
		}

		// Create a runtime script with the given bytecode
		auto script = runtime->CreateScript(bytecode);
		
		if (!script->Execute())
		{
			std::cerr << "Unable to execute test script #" << i << "\n";
			return -1;
		}
	}

	std::list<std::thread> threadList;
	int numCores = std::thread::hardware_concurrency();
	for (int n = 0; n < numCores; ++n)
	{
		threadList.push_back(std::thread([n, start, numCores, permutations, runtime, stopTime]()
		{
			Fuzzer sourceFuzzer;
			for (uint64_t j = n; j < permutations; j += numCores)
			{
				if (std::chrono::system_clock::now() > stopTime)
					break;
				for (int i = 0; i < static_cast<int>(std::size(s_testScripts)); ++i)
				{
					// Compile the text to bytecode
					auto bytecode = runtime->Compile(sourceFuzzer.Fuzz(s_testScripts[i], j + start), "Test Script");
					if (!bytecode)
						continue;

					// Create and execute the script if viable
					auto script = runtime->CreateScript(bytecode);
					if (!script)
						continue;
					do
					{
						if (!script->Execute())
							break;
					}
					while (!script->IsFinished());
				}
				auto stats = Jinx::GetMemoryStats();
				printf("Permutation %" PRIu64 " (Allocated Memory = %" PRIu64 " KB)\n", j + start, stats.allocatedMemory / 1024);
			}
		}));
	}

	// Wait for all threads to finish
	for (auto & t : threadList)
		t.join();
	threadList.clear();

	return 0;
}